

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl.cpp
# Opt level: O0

ImGuiContext * ImGui_Init(SDL_Window *window,SDL_GLContext gl_context)

{
  bool bVar1;
  int iVar2;
  bool res;
  ImGuiIO *io;
  ImGuiContext *ctx;
  bool err;
  char *glsl_version;
  void *sdl_gl_context;
  SDL_Window *in_stack_ffffffffffffffb0;
  ImGuiContext *local_48;
  undefined7 in_stack_ffffffffffffffc0;
  byte bVar3;
  
  if (!ImGui_Init::isInitialized) {
    iVar2 = gl3wInit();
    if (iVar2 != 0) {
      fprintf(_stderr,"Failed to initialize OpenGL loader!\n");
      return (ImGuiContext *)0x0;
    }
    ImGui_Init::isInitialized = true;
  }
  sdl_gl_context = (void *)0x2;
  ImGui::DebugCheckVersionAndDataLayout("1.80 WIP",0x1558,0x3bc,8,0x10,0x14,2);
  local_48 = (ImGuiContext *)ImGui::CreateContext((ImFontAtlas *)0x0);
  ImGui::SetCurrentContext(local_48);
  ImGui::GetIO();
  bVar3 = 1;
  bVar1 = ImGui_ImplSDL2_InitForOpenGL(in_stack_ffffffffffffffb0,sdl_gl_context);
  bVar3 = (bVar3 & 1 & bVar1) != 0;
  bVar1 = ImGui_ImplOpenGL3_Init((char *)CONCAT17(bVar3,in_stack_ffffffffffffffc0));
  if ((bVar3 & 1 & bVar1) == 0) {
    local_48 = (ImGuiContext *)0x0;
  }
  return local_48;
}

Assistant:

ImGuiContext* ImGui_Init(SDL_Window* window, SDL_GLContext gl_context) {
    // Decide GL+GLSL versions
#if __APPLE__
    // GL 3.2 Core + GLSL 150
    const char* glsl_version = "#version 150";
#elif __EMSCRIPTEN__
    const char* glsl_version = "#version 100";
#else
    // GL 3.0 + GLSL 130
    const char* glsl_version = "#version 130";
#endif

    static bool isInitialized = false;
    if (!isInitialized) {
        // Initialize OpenGL loader
#if defined(IMGUI_IMPL_OPENGL_LOADER_GL3W)
        bool err = gl3wInit() != 0;
#elif defined(IMGUI_IMPL_OPENGL_LOADER_GLEW)
        bool err = glewInit() != GLEW_OK;
#elif defined(IMGUI_IMPL_OPENGL_LOADER_GLAD)
        bool err = gladLoadGL() == 0;
#else
        bool err = false; // If you use IMGUI_IMPL_OPENGL_LOADER_CUSTOM, your loader is likely to requires some form of initialization.
#endif

        if (err) {
            fprintf(stderr, "Failed to initialize OpenGL loader!\n");
            return nullptr;
        }
        isInitialized = true;
    }

    // Setup Dear ImGui context
    IMGUI_CHECKVERSION();
    auto ctx = ImGui::CreateContext();
    ImGui::SetCurrentContext(ctx);

    ImGuiIO& io = ImGui::GetIO(); (void)io;
    //io.ConfigFlags |= ImGuiConfigFlags_NavEnableKeyboard;  // Enable Keyboard Controls
    //io.ConfigFlags |= ImGuiConfigFlags_NavEnableGamepad;   // Enable Gamepad Controls

    // Setup Platform/Renderer bindings
    bool res = true;
    res &= ImGui_ImplSDL2_InitForOpenGL(window, gl_context);
    res &= ImGui_ImplOpenGL3_Init(glsl_version);

    return res ? ctx : nullptr;
}